

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

GeometricObject * __thiscall Scene::intersect(Scene *this,Ray *r,double *t)

{
  double dVar1;
  pointer psVar2;
  long *plVar3;
  element_type *peVar4;
  char cVar5;
  int i;
  ulong uVar6;
  long lVar7;
  shared_ptr<GeometricObject> closest_obj;
  double local_50;
  __shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  local_48._M_ptr = (GeometricObject *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50 = 30000.0;
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    peVar4 = local_48._M_ptr;
    psVar2 = (this->solid).
             super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->solid).
                      super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar6)
    break;
    plVar3 = *(long **)((long)&(psVar2->
                               super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar7);
    cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,r,t);
    if (cVar5 != '\0') {
      dVar1 = *t;
      if (dVar1 < local_50) {
        std::__shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_48,
                   (__shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(((this->solid).
                             super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<GeometricObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   lVar7));
        local_50 = dVar1;
      }
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x10;
  }
  *t = local_50;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return peVar4;
}

Assistant:

GeometricObject *Scene::intersect(Ray& r, double& t)
{
    std::shared_ptr<GeometricObject> closest_obj;
    double           closest_dist = GEOM_INFINITY;

    for(int i = 0; i < solid.size(); ++i)
        if( solid[i]->intersect(r,t) )
            if( t < closest_dist )
            {
                closest_dist = t;
                closest_obj = solid[i];
            }
    t = closest_dist;
    return closest_obj.get();
}